

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cpp
# Opt level: O1

bool __thiscall
duckdb::VersioningUtils::ParseSemver
          (VersioningUtils *this,string *semver,idx_t *major_out,idx_t *minor_out,idx_t *patch_out)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  reference pvVar6;
  uint uVar7;
  undefined1 strict;
  string_t input;
  string_t input_00;
  string_t input_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  split;
  idx_t patch;
  idx_t minor;
  idx_t major;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> without_v;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  uint local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  uint local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c8;
  idx_t *local_b0;
  idx_t local_a8;
  idx_t local_a0;
  _Alloc_hider local_98;
  string local_90;
  string local_70;
  string local_50;
  
  strict = SUB81(patch_out,0);
  local_b0 = minor_out;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,*(long *)this,*(long *)(this + 8) + *(long *)this);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v","");
  bVar2 = StringUtil::StartsWith(&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (bVar2) {
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)this);
    StringUtil::Split(&local_c8,&local_50,'.');
    if ((long)local_c8.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_c8.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&local_c8,0);
      pcVar1 = (pvVar6->_M_dataplus)._M_p;
      local_d8 = (uint)pvVar6->_M_string_length;
      if (local_d8 < 0xd) {
        uStack_cc = 0;
        uStack_d4 = 0;
        uStack_d0 = 0;
        if (local_d8 != 0) {
          switchD_012dd528::default(&uStack_d4,pcVar1,(ulong)(local_d8 & 0xf));
        }
      }
      else {
        uStack_d4 = *(undefined4 *)pcVar1;
        uStack_d0 = SUB84(pcVar1,0);
        uStack_cc = (undefined4)((ulong)pcVar1 >> 0x20);
      }
      input.value._4_1_ = (undefined1)uStack_cc;
      input.value._5_1_ = uStack_cc._1_1_;
      input.value._6_1_ = uStack_cc._2_1_;
      input.value._7_1_ = uStack_cc._3_1_;
      input.value.pointer.length = uStack_d0;
      input.value.pointer.ptr = (char *)&local_98;
      bVar3 = TryCast::Operation<duckdb::string_t,unsigned_long>
                        ((TryCast *)CONCAT44(uStack_d4,local_d8),input,(uint64_t *)0x0,(bool)strict)
      ;
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&local_c8,1);
      pcVar1 = (pvVar6->_M_dataplus)._M_p;
      local_e8 = (uint)pvVar6->_M_string_length;
      if (local_e8 < 0xd) {
        uStack_dc = 0;
        uStack_e4 = 0;
        uStack_e0 = 0;
        if (local_e8 != 0) {
          switchD_012dd528::default(&uStack_e4,pcVar1,(ulong)(local_e8 & 0xf));
        }
      }
      else {
        uStack_e4 = *(undefined4 *)pcVar1;
        uStack_e0 = SUB84(pcVar1,0);
        uStack_dc = (undefined4)((ulong)pcVar1 >> 0x20);
      }
      input_00.value._4_1_ = (undefined1)uStack_dc;
      input_00.value._5_1_ = uStack_dc._1_1_;
      input_00.value._6_1_ = uStack_dc._2_1_;
      input_00.value._7_1_ = uStack_dc._3_1_;
      input_00.value.pointer.length = uStack_e0;
      input_00.value.pointer.ptr = (char *)&local_a0;
      bVar4 = TryCast::Operation<duckdb::string_t,unsigned_long>
                        ((TryCast *)CONCAT44(uStack_e4,local_e8),input_00,(uint64_t *)0x0,
                         (bool)strict);
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&local_c8,2);
      pcVar1 = (pvVar6->_M_dataplus)._M_p;
      uVar7 = (uint)pvVar6->_M_string_length;
      if (uVar7 < 0xd) {
        uStack_ec = 0;
        uStack_f4 = 0;
        uStack_f0 = 0;
        if (uVar7 != 0) {
          switchD_012dd528::default(&uStack_f4,pcVar1,(ulong)(uVar7 & 0xf));
        }
      }
      else {
        uStack_f4 = *(undefined4 *)pcVar1;
        uStack_f0 = SUB84(pcVar1,0);
        uStack_ec = (undefined4)((ulong)pcVar1 >> 0x20);
      }
      input_01.value._4_1_ = (undefined1)uStack_ec;
      input_01.value._5_1_ = uStack_ec._1_1_;
      input_01.value._6_1_ = uStack_ec._2_1_;
      input_01.value._7_1_ = uStack_ec._3_1_;
      input_01.value.pointer.length = uStack_f0;
      input_01.value.pointer.ptr = (char *)&local_a8;
      bVar5 = TryCast::Operation<duckdb::string_t,unsigned_long>
                        ((TryCast *)CONCAT44(uStack_f4,uVar7),input_01,(uint64_t *)0x0,(bool)strict)
      ;
      bVar2 = (bVar3 && bVar4) && bVar5;
      if ((bVar3 && bVar4) && bVar5) {
        (semver->_M_dataplus)._M_p = local_98._M_p;
        *major_out = local_a0;
        *local_b0 = local_a8;
      }
    }
    else {
      bVar2 = false;
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool VersioningUtils::ParseSemver(string &semver, idx_t &major_out, idx_t &minor_out, idx_t &patch_out) {
	if (!StringUtil::StartsWith(semver, "v")) {
		return false;
	}

	auto without_v = semver.substr(1);

	auto split = StringUtil::Split(without_v, '.');

	if (split.size() != 3) {
		return false;
	}

	idx_t major, minor, patch;
	bool succeeded = true;

	succeeded &= TryCast::Operation<string_t, idx_t>(split[0], major);
	succeeded &= TryCast::Operation<string_t, idx_t>(split[1], minor);
	succeeded &= TryCast::Operation<string_t, idx_t>(split[2], patch);

	if (!succeeded) {
		return false;
	}

	major_out = major;
	minor_out = minor;
	patch_out = patch;

	return true;
}